

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O0

void show_breadcrumb(char *name,void *memo_ptr)

{
  undefined8 *in_RSI;
  undefined8 in_RDI;
  TextMemo *memo;
  
  if (1 < *(int *)(in_RSI + 2)) {
    (*(code *)*in_RSI)("-> ");
  }
  if (0 < *(int *)(in_RSI + 2)) {
    (*(code *)*in_RSI)("%s ",in_RDI);
  }
  *(int *)(in_RSI + 2) = *(int *)(in_RSI + 2) + 1;
  return;
}

Assistant:

static void show_breadcrumb(const char *name, void *memo_ptr) {
    TextMemo *memo = (TextMemo *)memo_ptr;
    if (memo->depth > 1) {
        memo->printer("-> ");
    }
    if (memo->depth > 0) {
        memo->printer("%s ", name);
    }
    memo->depth++;
}